

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
LabelObjectState<true>::Float(LabelObjectState<true> *this,Context<true> *ctx,float v)

{
  char *__s1;
  int iVar1;
  stringstream *psVar2;
  ostream *poVar3;
  
  __s1 = ctx->key;
  iVar1 = strcasecmp(__s1,"Label");
  if (iVar1 == 0) {
    (ctx->ex->l).simple.label = v;
  }
  else {
    iVar1 = strcasecmp(__s1,"Initial");
    if (iVar1 == 0) {
      (ctx->ex->l).simple.initial = v;
    }
    else {
      iVar1 = strcasecmp(__s1,"Weight");
      if (iVar1 != 0) {
        iVar1 = strcasecmp(__s1,"Action");
        if (iVar1 == 0) {
          (this->cb_label).action = (uint32_t)(long)v;
        }
        else {
          iVar1 = strcasecmp(__s1,"Cost");
          if (iVar1 == 0) {
            (this->cb_label).cost = v;
          }
          else {
            iVar1 = strcasecmp(__s1,"Probability");
            if (iVar1 != 0) {
              psVar2 = Context<true>::error_abi_cxx11_(ctx);
              poVar3 = std::operator<<((ostream *)(psVar2 + 0x10),"Unsupported label property: \'");
              poVar3 = std::operator<<(poVar3,ctx->key);
              poVar3 = std::operator<<(poVar3,"\' len: ");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              return (BaseState<true> *)0x0;
            }
            (this->cb_label).probability = v;
          }
        }
        this->found_cb = true;
        return &this->super_BaseState<true>;
      }
      (ctx->ex->l).simple.weight = v;
    }
  }
  this->found = true;
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float v)
  {
    // simple
    if (!_stricmp(ctx.key, "Label"))
    {
      ctx.ex->l.simple.label = v;
      found = true;
    }
    else if (!_stricmp(ctx.key, "Initial"))
    {
      ctx.ex->l.simple.initial = v;
      found = true;
    }
    else if (!_stricmp(ctx.key, "Weight"))
    {
      ctx.ex->l.simple.weight = v;
      found = true;
    }
    // CB
    else if (!_stricmp(ctx.key, "Action"))
    {
      cb_label.action = (uint32_t)v;
      found_cb = true;
    }
    else if (!_stricmp(ctx.key, "Cost"))
    {
      cb_label.cost = v;
      found_cb = true;
    }
    else if (!_stricmp(ctx.key, "Probability"))
    {
      cb_label.probability = v;
      found_cb = true;
    }
    else
    {
      ctx.error() << "Unsupported label property: '" << ctx.key << "' len: " << ctx.key_length;
      return nullptr;
    }

    return this;
  }